

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O2

void lj_meta_call(lua_State *L,TValue *func,TValue *top)

{
  cTValue *pcVar1;
  
  pcVar1 = lj_meta_lookup(L,func,MM_call);
  if ((pcVar1->field_2).it != 0xfffffff7) {
    lj_err_optype_call(L,func);
  }
  for (; func < top; top = top + -1) {
    *top = top[-1];
  }
  func->field_2 = (anon_struct_8_2_fd66bcdd_for_TValue_2)*pcVar1;
  return;
}

Assistant:

void lj_meta_call(lua_State *L, TValue *func, TValue *top)
{
  cTValue *mo = lj_meta_lookup(L, func, MM_call);
  TValue *p;
  if (!tvisfunc(mo))
    lj_err_optype_call(L, func);
  for (p = top; p > func; p--) copyTV(L, p, p-1);
  copyTV(L, func, mo);
}